

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rasterizer.hpp
# Opt level: O2

void __thiscall
eos::render::Rasterizer<eos::render::ExtractionFragmentShader>::raster_triangle<double>
          (Rasterizer<eos::render::ExtractionFragmentShader> *this,Vertex<double> *point_a,
          Vertex<double> *point_b,Vertex<double> *point_c,optional<eos::render::Texture> *texture)

{
  double dVar1;
  double dVar2;
  char cVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  optional<eos::render::Texture> *this_00;
  Image<eos::core::Pixel<unsigned_char,_4>_> *this_01;
  int y;
  ulong uVar9;
  double *pdVar10;
  Texture *pTVar11;
  Pixel<unsigned_char,_4> *pPVar12;
  int xi;
  int x;
  float fVar13;
  float y_00;
  float fVar14;
  float dudx;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar15;
  float x_00;
  float fVar16;
  float fVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  float fVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  Rect<int> RVar33;
  Vector3<double> local_178;
  optional<eos::render::Texture> *local_158;
  Image<double> *local_150;
  undefined1 local_148 [16];
  Vector4<double> local_138;
  plane beta_plane;
  plane alpha_plane;
  Vector3<double> local_f8;
  float local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  ulong local_c8;
  ulong local_c0;
  Rasterizer<eos::render::ExtractionFragmentShader> *local_b8;
  Image<eos::core::Pixel<unsigned_char,_4>_> *local_b0;
  plane gamma_plane;
  
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  local_178.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  local_178.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  local_158 = texture;
  RVar33 = detail::calculate_clipped_bounding_box<double>
                     ((Vector2<double> *)&local_138,(Vector2<double> *)&local_178,
                      (Vector2<double> *)&local_f8,this->viewport_width,this->viewport_height);
  local_c8 = RVar33._0_8_;
  uVar9 = local_c8 >> 0x20;
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
       (point_a->texcoords).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
       m_data.array[0] *
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  local_178.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (point_b->texcoords).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
       m_data.array[0] *
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  local_178.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  local_178.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (point_c->texcoords).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
       m_data.array[0] *
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  local_c0 = (ulong)(uint)(RVar33.height + RVar33.y);
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  detail::plane::plane<double>(&alpha_plane,(Vector3<double> *)&local_138,&local_178,&local_f8);
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
       (point_a->texcoords).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
       m_data.array[1] *
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  local_178.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (point_b->texcoords).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
       m_data.array[1] *
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  local_178.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  local_178.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (point_c->texcoords).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
       m_data.array[1] *
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  detail::plane::plane<double>(&beta_plane,(Vector3<double> *)&local_138,&local_178,&local_f8);
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  local_178.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array.
  _0_16_ = *(undefined1 (*) [16])
            (point_b->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
            m_storage.m_data.array;
  local_178.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  detail::plane::plane<double>(&gamma_plane,(Vector3<double> *)&local_138,&local_178,&local_f8);
  fVar15 = 1.0 / alpha_plane.c;
  fVar21 = 1.0 / beta_plane.c;
  fVar13 = 1.0 / gamma_plane.c;
  fVar26 = -alpha_plane.a;
  fVar27 = -beta_plane.a;
  fVar28 = -gamma_plane.a;
  fVar29 = -alpha_plane.b;
  fVar30 = -beta_plane.b;
  fVar32 = -gamma_plane.b;
  local_150 = &this->depthbuffer;
  local_b0 = &this->colorbuffer;
  local_b8 = this;
  do {
    y = (int)uVar9;
    if ((int)local_c0 < y) {
      return;
    }
    y_00 = (float)y + 0.5;
    uVar9 = local_c8 & 0xffffffff;
    while (x = (int)uVar9, x <= RVar33.width + RVar33.x) {
      x_00 = (float)x + 0.5;
      dVar18 = detail::implicit_line<double>
                         ((float)(point_a->position).
                                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                 m_storage.m_data.array[0],
                          (float)(point_a->position).
                                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                 m_storage.m_data.array[1],&point_b->position,&point_c->position);
      local_148._8_4_ = extraout_XMM0_Dc;
      local_148._0_8_ = dVar18;
      local_148._12_4_ = extraout_XMM0_Dd;
      dVar18 = detail::implicit_line<double>
                         ((float)(point_b->position).
                                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                 m_storage.m_data.array[0],
                          (float)(point_b->position).
                                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                 m_storage.m_data.array[1],&point_c->position,&point_a->position);
      dVar19 = detail::implicit_line<double>
                         ((float)(point_c->position).
                                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                 m_storage.m_data.array[0],
                          (float)(point_c->position).
                                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                 m_storage.m_data.array[1],&point_a->position,&point_b->position);
      dVar5 = detail::implicit_line<double>(x_00,y_00,&point_b->position,&point_c->position);
      dVar6 = detail::implicit_line<double>(x_00,y_00,&point_c->position,&point_a->position);
      auVar20._8_4_ = SUB84(dVar18,0);
      auVar20._0_8_ = local_148._0_8_;
      auVar20._12_4_ = (int)((ulong)dVar18 >> 0x20);
      auVar20 = divpd(_DAT_00183150,auVar20);
      dVar5 = dVar5 * auVar20._0_8_;
      dVar6 = dVar6 * auVar20._8_8_;
      auVar7._8_4_ = SUB84(dVar6,0);
      auVar7._0_8_ = dVar5;
      auVar7._12_4_ = (int)((ulong)dVar6 >> 0x20);
      dVar18 = detail::implicit_line<double>(x_00,y_00,&point_a->position,&point_b->position);
      if (((0.0 <= dVar5) && (dVar8 = auVar7._8_8_, 0.0 <= dVar8)) &&
         (dVar18 = (1.0 / dVar19) * dVar18, 0.0 <= dVar18)) {
        dVar19 = (point_c->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                 m_storage.m_data.array[2] * dVar18 +
                 (point_a->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                 m_storage.m_data.array[2] * dVar5 +
                 (point_b->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                 m_storage.m_data.array[2] * dVar8;
        cVar3 = this->enable_depth_test;
        local_148._0_8_ = dVar19;
        dVar1 = dVar6;
        if ((bool)cVar3 == true) {
          bVar4 = this->enable_far_clipping;
          pdVar10 = core::Image<double>::operator()(local_150,y,x);
          if ((byte)(*pdVar10 <= (double)local_148._0_8_ | 1.0 < dVar19 & bVar4) == 1) {
            cVar3 = this->enable_depth_test;
            dVar1 = dVar8;
            goto joined_r0x00176db0;
          }
        }
        else {
joined_r0x00176db0:
          dVar8 = dVar1;
          if (cVar3 != '\0') goto LAB_00177154;
        }
        this_00 = local_158;
        if (this->perspective_correct_barycentric_weights == true) {
          dVar19 = (point_a->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                   m_storage.m_data.array[3];
          dVar1 = (point_b->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                  m_storage.m_data.array[3];
          dVar2 = (point_c->position).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                  m_storage.m_data.array[3];
          dVar8 = 1.0 / (dVar18 * dVar2 + dVar5 * dVar19 + dVar8 * dVar1);
          dVar5 = dVar5 * dVar8 * dVar19;
          dVar6 = dVar6 * dVar8 * dVar1;
          dVar18 = dVar18 * dVar2 * dVar8;
        }
        local_178.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1]._0_4_ = SUB84(dVar6,0);
        local_178.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] = dVar5;
        local_178.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1]._4_4_ = (int)((ulong)dVar6 >> 0x20);
        local_178.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2] = dVar18;
        if ((local_158->super__Optional_base<eos::render::Texture,_false,_false>)._M_payload.
            super__Optional_payload<eos::render::Texture,_true,_false,_false>.
            super__Optional_payload_base<eos::render::Texture>._M_engaged == true) {
          fVar31 = -(gamma_plane.a * x_00 + gamma_plane.b * y_00 + gamma_plane.d) * fVar13;
          fVar17 = 1.0 / (fVar31 * fVar31);
          fVar14 = (alpha_plane.a * x_00 + alpha_plane.b * y_00 + alpha_plane.d) * fVar15;
          fVar16 = (beta_plane.a * x_00 + beta_plane.b * y_00 + beta_plane.d) * fVar21;
          local_d8 = (fVar27 * fVar21 * fVar31 + fVar28 * fVar13 * fVar16) * fVar17;
          uStack_d4 = 0x80000000;
          uStack_d0 = 0x80000000;
          uStack_cc = 0x80000000;
          pTVar11 = std::optional<eos::render::Texture>::value(local_158);
          dudx = (float)((pTVar11->mipmaps).
                         super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->width_ *
                 (fVar26 * fVar15 * fVar31 + fVar28 * fVar13 * fVar14) * fVar17;
          pTVar11 = std::optional<eos::render::Texture>::value(this_00);
          local_d8 = (float)((pTVar11->mipmaps).
                             super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->width_ * local_d8;
          pTVar11 = std::optional<eos::render::Texture>::value(this_00);
          fVar14 = (float)((pTVar11->mipmaps).
                           super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->height_ *
                   (fVar29 * fVar15 * fVar31 + fVar14 * fVar32 * fVar13) * fVar17;
          pTVar11 = std::optional<eos::render::Texture>::value(this_00);
          fVar16 = (float)((pTVar11->mipmaps).
                           super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->height_ *
                   (fVar31 * fVar30 * fVar21 + fVar16 * fVar32 * fVar13) * fVar17;
          fVar17 = local_d8;
        }
        else {
          dudx = 0.0;
          fVar17 = 0.0;
          fVar14 = 0.0;
          fVar16 = 0.0;
        }
        ExtractionFragmentShader::shade_triangle_pixel<double>
                  (&local_138,(ExtractionFragmentShader *)this,(int)x_00,(int)y_00,point_a,point_b,
                   point_c,&local_178,this_00,dudx,fVar17,fVar14,fVar16);
        this_01 = local_b0;
        uVar23 = 0;
        uVar25 = 0x3ff00000;
        uVar22 = uVar23;
        uVar24 = uVar25;
        if (local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
            array[0] <= 1.0) {
          uVar22 = SUB84(local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                         m_storage.m_data.array[0],0);
          uVar24 = (undefined4)
                   ((ulong)local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                           m_storage.m_data.array[0] >> 0x20);
        }
        if (local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
            array[1] <= 1.0) {
          uVar23 = SUB84(local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                         m_storage.m_data.array[1],0);
          uVar25 = (undefined4)
                   ((ulong)local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                           m_storage.m_data.array[1] >> 0x20);
        }
        dVar18 = 1.0;
        if (local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
            array[2] <= 1.0) {
          dVar18 = local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                   m_data.array[2];
        }
        dVar19 = 1.0;
        if (local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
            array[3] <= 1.0) {
          dVar19 = local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                   m_data.array[3];
        }
        pPVar12 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(local_b0,y,x);
        (pPVar12->data_)._M_elems[0] = (uchar)(int)(dVar18 * 255.0);
        pPVar12 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(this_01,y,x);
        (pPVar12->data_)._M_elems[1] = (uchar)(int)((double)CONCAT44(uVar25,uVar23) * 255.0);
        pPVar12 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(this_01,y,x);
        (pPVar12->data_)._M_elems[2] = (uchar)(int)((double)CONCAT44(uVar24,uVar22) * 255.0);
        pPVar12 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(this_01,y,x);
        this = local_b8;
        (pPVar12->data_)._M_elems[3] = (uchar)(int)(dVar19 * 255.0);
        if (local_b8->enable_depth_test == true) {
          pdVar10 = core::Image<double>::operator()(local_150,y,x);
          *pdVar10 = (double)local_148._0_8_;
        }
      }
LAB_00177154:
      uVar9 = (ulong)(x + 1);
    }
    uVar9 = (ulong)(y + 1);
  } while( true );
}

Assistant:

void raster_triangle(const detail::Vertex<T>& point_a, const detail::Vertex<T>& point_b,
                         const detail::Vertex<T>& point_c, const cpp17::optional<Texture>& texture)
    {
        // We already calculated this in the culling/clipping stage. Maybe we should save/cache it after all.
        const auto boundingBox = detail::calculate_clipped_bounding_box(
            Eigen::Vector2<T>(point_a.position.x(), point_a.position.y()),
            Eigen::Vector2<T>(point_b.position.x(), point_b.position.y()),
            Eigen::Vector2<T>(point_c.position.x(), point_c.position.y()), viewport_width, viewport_height);
        const auto min_x = boundingBox.x;
        const auto max_x = boundingBox.x + boundingBox.width;
        const auto min_y = boundingBox.y;
        const auto max_y = boundingBox.y + boundingBox.height;

        // These are triangle-specific, i.e. calculate once per triangle.
        // These ones are needed for perspective correct lambdas! (as well as mipmapping)
        const auto& one_over_w0 = point_a.position[3];
        const auto& one_over_w1 = point_b.position[3];
        const auto& one_over_w2 = point_c.position[3];

        // These are triangle-specific, i.e. calculate once per triangle.
        // For partial derivatives computation (for mipmapping, texturing) (they work on screen-space coords):
        using eos::render::detail::plane;
        const auto alpha_plane = plane(
            Eigen::Vector3<T>(point_a.position[0], point_a.position[1], point_a.texcoords[0] * one_over_w0),
            Eigen::Vector3<T>(point_b.position[0], point_b.position[1], point_b.texcoords[0] * one_over_w1),
            Eigen::Vector3<T>(point_c.position[0], point_c.position[1], point_c.texcoords[0] * one_over_w2));
        const auto beta_plane = plane(
            Eigen::Vector3<T>(point_a.position[0], point_a.position[1], point_a.texcoords[1] * one_over_w0),
            Eigen::Vector3<T>(point_b.position[0], point_b.position[1], point_b.texcoords[1] * one_over_w1),
            Eigen::Vector3<T>(point_c.position[0], point_c.position[1], point_c.texcoords[1] * one_over_w2));
        const auto gamma_plane =
            plane(Eigen::Vector3<T>(point_a.position[0], point_a.position[1], one_over_w0),
                  Eigen::Vector3<T>(point_b.position[0], point_b.position[1], one_over_w1),
                  Eigen::Vector3<T>(point_c.position[0], point_c.position[1], one_over_w2));
        const auto one_over_alpha_c = 1.0f / alpha_plane.c;
        const auto one_over_beta_c = 1.0f / beta_plane.c;
        const auto one_over_gamma_c = 1.0f / gamma_plane.c;
        const auto alpha_ffx = -alpha_plane.a * one_over_alpha_c;
        const auto beta_ffx = -beta_plane.a * one_over_beta_c;
        const auto gamma_ffx = -gamma_plane.a * one_over_gamma_c;
        const auto alpha_ffy = -alpha_plane.b * one_over_alpha_c;
        const auto beta_ffy = -beta_plane.b * one_over_beta_c;
        const auto gamma_ffy = -gamma_plane.b * one_over_gamma_c;

        for (int yi = min_y; yi <= max_y; ++yi)
        {
            for (int xi = min_x; xi <= max_x; ++xi)
            {
                // we want centers of pixels to be used in computations. Todo: Do we? Do we pass it with or
                // without +0.5 to the FragShader?
                const float x = static_cast<float>(xi) + 0.5f; // double? T?
                const float y = static_cast<float>(yi) + 0.5f;

                // These will be used for barycentric weights computation
                using detail::implicit_line;
                const double one_over_v0ToLine12 =
                    1.0 / implicit_line(point_a.position[0], point_a.position[1], point_b.position,
                                        point_c.position);
                const double one_over_v1ToLine20 =
                    1.0 / implicit_line(point_b.position[0], point_b.position[1], point_c.position,
                                        point_a.position);
                const double one_over_v2ToLine01 =
                    1.0 / implicit_line(point_c.position[0], point_c.position[1], point_a.position,
                                        point_b.position);
                // Affine barycentric weights:
                double alpha = implicit_line(x, y, point_b.position, point_c.position) * one_over_v0ToLine12;
                double beta = implicit_line(x, y, point_c.position, point_a.position) * one_over_v1ToLine20;
                double gamma = implicit_line(x, y, point_a.position, point_b.position) * one_over_v2ToLine01;

                // if pixel (x, y) is inside the triangle or on one of its edges
                if (alpha >= 0 && beta >= 0 && gamma >= 0)
                {
                    const int pixel_index_row = yi;
                    const int pixel_index_col = xi;

                    // TODO: Check this one. What about perspective?
                    const double z_affine = alpha * static_cast<double>(point_a.position[2]) +
                                            beta * static_cast<double>(point_b.position[2]) +
                                            gamma * static_cast<double>(point_c.position[2]);

                    bool draw = true;
                    if (enable_far_clipping)
                    {
                        if (z_affine > 1.0)
                        {
                            draw = false;
                        }
                    }

                    bool passes_depth_test = false;
                    if (enable_depth_test)
                    {
                        // If enable_depth_test=false, avoid accessing the depthbuffer at all - it might be
                        // empty or have other dimensions.
                        passes_depth_test =
                            (z_affine < depthbuffer(pixel_index_row, pixel_index_col));
                    }
                    // The '<= 1.0' clips against the far-plane in NDC. We clip against the near-plane
                    // earlier.
                    // if (z_affine < depthbuffer.at<double>(pixelIndexRow, pixelIndexCol)/* && z_affine <=
                    // 1.0*/) // what to do in ortho case without n/f "squashing"? should we always squash? or
                    // a flag?
                    if ((passes_depth_test && draw) || enable_depth_test == false)
                    {
                        // perspective-correct barycentric weights
                        // Todo: Check this in the original/older implementation, i.e. if all is still
                        //   perspective-correct. I think so. Also compare 1:1 with OpenGL.
                        // This is the default case when rendering - we perspectively correct the barycentric
                        //   weights. However when extracting texture, it seems we don't want to do that, and
                        //   pass the uncorrected lambda in that case. This switch allows us to do that.
                        if (perspective_correct_barycentric_weights)
                        {
                            double d = alpha * one_over_w0 + beta * one_over_w1 + gamma * one_over_w2;
                            d = 1.0 / d;
                            alpha *= d * one_over_w0; // In case of affine cam matrix, everything is 1 and
                                                      // a/b/g don't get changed.
                            beta *= d * one_over_w1;
                            gamma *= d * one_over_w2;
                        }
                        Eigen::Vector3<T> lambda(alpha, beta, gamma);

                        Eigen::Vector4<T> pixel_color;
                        if (texture)
                        {
                            // check if texture != NULL?
                            // partial derivatives (for mip-mapping, not needed for texturing otherwise!)
                            const float u_over_z =
                                -(alpha_plane.a * x + alpha_plane.b * y + alpha_plane.d) * one_over_alpha_c;
                            const float v_over_z =
                                -(beta_plane.a * x + beta_plane.b * y + beta_plane.d) * one_over_beta_c;
                            const float one_over_z =
                                -(gamma_plane.a * x + gamma_plane.b * y + gamma_plane.d) * one_over_gamma_c;
                            const float one_over_squared_one_over_z = 1.0f / std::pow(one_over_z, 2);

                            // partial derivatives of U/V coordinates with respect to X/Y pixel's screen
                            // coordinates
                            // These are exclusively used for the mipmap level computation (i.e. which mipmap
                            // levels to use).
                            // They're not needed for texturing otherwise at all!
                            float dudx =
                                one_over_squared_one_over_z * (alpha_ffx * one_over_z - u_over_z * gamma_ffx);
                            float dudy =
                                one_over_squared_one_over_z * (beta_ffx * one_over_z - v_over_z * gamma_ffx);
                            float dvdx =
                                one_over_squared_one_over_z * (alpha_ffy * one_over_z - u_over_z * gamma_ffy);
                            float dvdy =
                                one_over_squared_one_over_z * (beta_ffy * one_over_z - v_over_z * gamma_ffy);
                            dudx *= texture.value().mipmaps[0].width();
                            dudy *= texture.value().mipmaps[0].width();
                            dvdx *= texture.value().mipmaps[0].height();
                            dvdy *= texture.value().mipmaps[0].height();

                            // Why does it need x and y? Maybe some shaders (eg TexExtr?) need it?
                            pixel_color = fragment_shader.shade_triangle_pixel(
                                x, y, point_a, point_b, point_c, lambda, texture, dudx, dudy, dvdx, dvdy);

                        } else
                        { // We use vertex-coloring
                            // Why does it need x and y?
                            pixel_color = fragment_shader.shade_triangle_pixel(
                                x, y, point_a, point_b, point_c, lambda, texture, 0, 0, 0, 0);
                        }

                        // clamp bytes to 255
                        // Todo: Proper casting (rounding?)? And we don't clamp/max against 255? Use
                        // glm::clamp?
                        const unsigned char red =
                            static_cast<unsigned char>(255.0f * std::min(pixel_color[0], T(1)));
                        const unsigned char green =
                            static_cast<unsigned char>(255.0f * std::min(pixel_color[1], T(1)));
                        const unsigned char blue =
                            static_cast<unsigned char>(255.0f * std::min(pixel_color[2], T(1)));
                        const unsigned char alpha =
                            static_cast<unsigned char>(255.0f * std::min(pixel_color[3], T(1)));

                        // update buffers
                        colorbuffer(pixel_index_row, pixel_index_col)[0] = blue;
                        colorbuffer(pixel_index_row, pixel_index_col)[1] = green;
                        colorbuffer(pixel_index_row, pixel_index_col)[2] = red;
                        colorbuffer(pixel_index_row, pixel_index_col)[3] = alpha;
                        if (enable_depth_test) // TODO: A better name for this might be enable_zbuffer? or
                                               // enable_zbuffer_test?
                        {
                            depthbuffer(pixel_index_row, pixel_index_col) = z_affine;
                        }
                    }
                }
            }
        }
    }